

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O2

int __thiscall libtorrent::bdecode_node::dict_size(bdecode_node *this)

{
  int iVar1;
  int iVar2;
  
  if (this->m_size != -1) {
    return this->m_size;
  }
  if (this->m_last_index == -1) {
    iVar2 = this->m_token_idx + 1;
    iVar1 = 0;
  }
  else {
    iVar1 = this->m_last_index * 2;
    iVar2 = this->m_last_token;
  }
  while ((SUB84(this->m_root_tokens[iVar2],0) & 0xe0000000) != 0xa0000000) {
    iVar2 = (SUB84(this->m_root_tokens[iVar2],4) & 0x1fffffff) + iVar2;
    iVar1 = iVar1 + 1;
  }
  this->m_size = iVar1 / 2;
  return iVar1 / 2;
}

Assistant:

int bdecode_node::dict_size() const
	{
		TORRENT_ASSERT(type() == dict_t);
		TORRENT_ASSERT(m_token_idx != -1);

		if (m_size != -1) return m_size;

		bdecode_token const* tokens = m_root_tokens;
		TORRENT_ASSERT(tokens[m_token_idx].type == bdecode_token::dict);

		// this is the first item
		int token = m_token_idx + 1;
		int ret = 0;

		if (m_last_index != -1)
		{
			ret = m_last_index * 2;
			token = m_last_token;
		}

		while (tokens[token].type != bdecode_token::end)
		{
			token += tokens[token].next_item;
			++ret;
		}

		// a dictionary must contain full key-value pairs. which means
		// the number of entries is divisible by 2
		TORRENT_ASSERT((ret % 2) == 0);

		// each item is one key and one value, so divide by 2
		ret /= 2;

		m_size = ret;

		return ret;
	}